

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int verify_sign(void *verify_ctx,ptls_iovec_t data,ptls_iovec_t signature)

{
  int iVar1;
  EVP_MD_CTX *ctx;
  EVP_MD *pEVar2;
  int iVar3;
  EVP_PKEY_CTX *pkey_ctx;
  EVP_PKEY_CTX *local_48;
  EVP_PKEY_CTX *local_40;
  size_t local_38;
  
  local_48 = (EVP_PKEY_CTX *)0x0;
  if (data.base == (uint8_t *)0x0) {
    ctx = (EVP_MD_CTX *)0x0;
    iVar3 = 0;
  }
  else {
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx == (EVP_MD_CTX *)0x0) {
      iVar3 = 0x201;
      ctx = (EVP_MD_CTX *)0x0;
    }
    else {
      local_38 = signature.len;
      pEVar2 = EVP_sha256();
      iVar1 = EVP_DigestVerifyInit(ctx,&local_48,pEVar2,(ENGINE *)0x0,(EVP_PKEY *)verify_ctx);
      iVar3 = 0x203;
      if (iVar1 == 1) {
        iVar1 = EVP_PKEY_get_id(verify_ctx);
        if (iVar1 == 6) {
          iVar1 = EVP_PKEY_CTX_set_rsa_padding(local_48,6);
          if ((iVar1 != 1) ||
             (iVar1 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_48,0xffffffff), iVar1 != 1))
          goto LAB_0012b6c3;
          local_40 = local_48;
          pEVar2 = EVP_sha256();
          iVar1 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_40,pEVar2);
          if (iVar1 != 1) goto LAB_0012b6c3;
        }
        iVar1 = EVP_DigestVerifyUpdate(ctx,data.base,data.len);
        if (iVar1 == 1) {
          iVar1 = EVP_DigestVerifyFinal(ctx,signature.base,local_38);
          iVar3 = 0x33;
          if (iVar1 == 1) {
            iVar3 = 0;
          }
        }
      }
    }
  }
LAB_0012b6c3:
  if (ctx != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free(ctx);
  }
  EVP_PKEY_free((EVP_PKEY *)verify_ctx);
  return iVar3;
}

Assistant:

static int verify_sign(void *verify_ctx, ptls_iovec_t data, ptls_iovec_t signature)
{
    EVP_PKEY *key = verify_ctx;
    EVP_MD_CTX *ctx = NULL;
    EVP_PKEY_CTX *pkey_ctx = NULL;
    int ret = 0;

    if (data.base == NULL)
        goto Exit;

    if ((ctx = EVP_MD_CTX_create()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_DigestVerifyInit(ctx, &pkey_ctx, EVP_sha256(), NULL, key) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_id(key) == EVP_PKEY_RSA) {
        if (EVP_PKEY_CTX_set_rsa_padding(pkey_ctx, RSA_PKCS1_PSS_PADDING) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx, -1) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        if (EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx, EVP_sha256()) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
    }
    if (EVP_DigestVerifyUpdate(ctx, data.base, data.len) != 1) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_DigestVerifyFinal(ctx, signature.base, signature.len) != 1) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    if (ctx != NULL)
        EVP_MD_CTX_destroy(ctx);
    EVP_PKEY_free(key);
    return ret;
}